

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node*,Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *a,Node *as,
          Literal *as_1,bool as_2,bool as_3,AbstractingUnifier *as_4,AbstractionOracle as_5,
          bool as_6)

{
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  Literal *local_58;
  Node *local_50;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *local_48;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> **local_40;
  Node **local_38;
  Literal **local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  AbstractingUnifier **local_18;
  AbstractionOracle *local_10;
  undefined1 *local_8;
  
  local_40 = &local_48;
  local_38 = &local_50;
  local_30 = &local_58;
  local_28 = &local_59;
  local_20 = &local_5a;
  local_8 = &local_5b;
  local_5b = as_6;
  local_18 = &as_4;
  local_10 = &as_5;
  local_5a = as_3;
  local_59 = as_2;
  local_58 = as_1;
  local_50 = as;
  local_48 = a;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_*,_Kernel::Literal_*,_bool,_bool,_Kernel::AbstractingUnifier_*,_Kernel::AbstractionOracle,_bool>
  ::anon_class_64_8_e3e07548::operator()((anon_class_64_8_e3e07548 *)this);
  return;
}

Assistant:

Recycled(A a, As... as) 
    : _self([&](){ 
        if (mem().isNonEmpty()) {
          auto elem = mem().pop();
          elem->init(std::move(a), std::move(as)...);
          return elem;
        } else {
          return IF_USE_PTRS(std::make_unique<T>, T)(std::move(a), std::move(as)...);
        }
    }())
  { }